

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Man_t * Aig_ManDupRepres(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Aig_Obj_t **ppAVar4;
  uint uVar5;
  int iVar6;
  Aig_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int *__dest;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  ulong uVar12;
  Aig_Obj_t *pAVar13;
  ulong uVar14;
  long lVar15;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    iVar6 = pVVar2->nSize;
    lVar15 = (long)iVar6;
    pVVar9->nSize = iVar6;
    pVVar9->nCap = iVar6;
    if (lVar15 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar15 * 4);
    }
    pVVar9->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar15 << 2);
    p_00->vFlopNums = pVVar9;
  }
  Aig_ManCleanData(p);
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar15];
      if (pvVar3 != (void *)0x0) {
        uVar5 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if ((uVar5 & 7) - 7 < 0xfffffffe) {
          uVar5 = uVar5 & 7;
          if (uVar5 == 3) {
            uVar12 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if (p->pReprs == (Aig_Obj_t **)0x0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = p->pReprs[*(int *)(uVar12 + 0x24)];
            }
            if (pAVar11 == (Aig_Obj_t *)0x0) {
              uVar12 = *(ulong *)(uVar12 + 0x28);
            }
            else {
              uVar12 = (ulong)((*(uint *)&pAVar11->field_0x18 ^ *(uint *)(uVar12 + 0x18)) >> 3 & 1)
                       ^ (ulong)(pAVar11->field_5).pData;
            }
            pAVar11 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                           ((uint)*(ulong *)((long)pvVar3 + 8) & 1 ^ uVar12));
          }
          else if (uVar5 == 2) {
            pAVar11 = Aig_ObjCreateCi(p_00);
            *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
            if (p->pReprs == (Aig_Obj_t **)0x0) {
              pAVar13 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar13 = p->pReprs[*(int *)((long)pvVar3 + 0x24)];
            }
            if (pAVar13 != (Aig_Obj_t *)0x0) {
              pAVar11 = (Aig_Obj_t *)
                        ((ulong)((*(uint *)&pAVar13->field_0x18 ^ *(uint *)((long)pvVar3 + 0x18)) >>
                                 3 & 1) ^ (ulong)(pAVar13->field_5).pData);
            }
          }
          else {
            if (((ulong)pvVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar5 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                            ,0x3b5,"Aig_Man_t *Aig_ManDupRepres(Aig_Man_t *)");
            }
            pAVar11 = p_00->pConst1;
          }
        }
        else {
          uVar12 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          ppAVar4 = p->pReprs;
          if (ppAVar4 == (Aig_Obj_t **)0x0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = ppAVar4[*(int *)(uVar12 + 0x24)];
          }
          if (pAVar11 == (Aig_Obj_t *)0x0) {
            uVar12 = *(ulong *)(uVar12 + 0x28);
          }
          else {
            uVar12 = (ulong)((*(uint *)&pAVar11->field_0x18 ^ *(uint *)(uVar12 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar11->field_5).pData;
          }
          uVar14 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (ppAVar4 == (Aig_Obj_t **)0x0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = ppAVar4[*(int *)(uVar14 + 0x24)];
          }
          if (pAVar11 == (Aig_Obj_t *)0x0) {
            uVar14 = *(ulong *)(uVar14 + 0x28);
          }
          else {
            uVar14 = (ulong)((*(uint *)&pAVar11->field_0x18 ^ *(uint *)(uVar14 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar11->field_5).pData;
          }
          pAVar11 = Aig_And(p_00,(Aig_Obj_t *)(uVar12 ^ (uint)*(ulong *)((long)pvVar3 + 8) & 1),
                            (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1 ^ uVar14));
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
      }
      lVar15 = lVar15 + 1;
      pVVar10 = p->vObjs;
    } while (lVar15 < pVVar10->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar6 = Aig_ManCheck(p_00);
  if (iVar6 == 0) {
    puts("Aig_ManDupRepres: Check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupRepres( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) );
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObj->pData = Aig_ObjCreateCi(pNew);
            pObj->pData = Aig_ObjGetRepres( p, pObj );
        }
        else if ( Aig_ObjIsCo(pObj) )
            pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Repres(p, pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->pData = Aig_ManConst1(pNew);
        else
            assert( 0 );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepres: Check has failed.\n" );
    return pNew;
}